

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.hpp
# Opt level: O2

void __thiscall cinatra::http_parser::parse_body_len(http_parser *this)

{
  string_view sVar1;
  __integer_from_chars_result_type<long> _Var2;
  
  sVar1._M_str = "content-length";
  sVar1._M_len = 0xe;
  sVar1 = get_header_value(this,sVar1);
  if (sVar1._M_len == 0) {
    this->body_len_ = 0;
  }
  else {
    _Var2 = std::from_chars<long>(sVar1._M_str,sVar1._M_str + sVar1._M_len,&this->body_len_,10);
    if (_Var2.ec != 0) {
      this->body_len_ = -1;
    }
  }
  return;
}

Assistant:

void parse_body_len() {
    auto header_value = this->get_header_value("content-length"sv);
    if (header_value.empty()) {
      body_len_ = 0;
    }
    else {
      auto [ptr, ec] = std::from_chars(
          header_value.data(), header_value.data() + header_value.size(),
          body_len_, 10);
      if (ec != std::errc{}) {
        body_len_ = -1;
      }
    }
  }